

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Float __thiscall pbrt::DebugMLTSampler::Get1D(DebugMLTSampler *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  MLTSampler *in_RDI;
  char (*in_stack_00000008) [9];
  char (*in_stack_00000010) [6];
  char *in_stack_00000018;
  int in_stack_00000024;
  size_type vb;
  int va;
  int index;
  char (*in_stack_00000040) [6];
  int *in_stack_00000048;
  char (*in_stack_00000050) [9];
  unsigned_long *in_stack_00000058;
  
  iVar1 = MLTSampler::GetNextIndex(in_RDI);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 1));
  if (sVar2 <= (ulong)(long)iVar1) {
    LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
              (index,(char *)vb,in_stack_00000024,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,in_stack_00000040,in_stack_00000048,in_stack_00000050,
               in_stack_00000058);
  }
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 1),(long)iVar1);
  return *pvVar3;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        int index = GetNextIndex();
        CHECK_LT(index, u.size());
#ifdef PBRT_IS_GPU_CODE
        return 0;
#else
        return u[index];
#endif
    }